

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.hpp
# Opt level: O2

void bits::rand_keys(mt19937_64 *rnd64,uint64_t *keys,uint32_t *indices,uint64_t *copy,uint32_t size
                    )

{
  result_type rVar1;
  ulong uVar2;
  
  for (uVar2 = 0; size != uVar2; uVar2 = uVar2 + 1) {
    rVar1 = std::
            mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
            ::operator()(rnd64);
    keys[uVar2] = rVar1;
    copy[uVar2] = rVar1;
    indices[uVar2] = (uint32_t)uVar2;
  }
  return;
}

Assistant:

inline void rand_keys(
    std::mt19937_64& rnd64, uint64_t* keys, uint32_t* indices, uint64_t* copy, uint32_t size)
{
    for (uint32_t i = 0; i < size; ++i)
    {
        keys[i] = rnd64();
        copy[i] = keys[i];
        indices[i] = i;
    }
}